

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O2

void jinit_d_coef_controller(j_decompress_ptr cinfo,boolean need_full_buffer)

{
  _func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *p_Var1;
  JDIMENSION JVar2;
  jpeg_d_coef_controller *pjVar3;
  long lVar4;
  long lVar5;
  jvirt_barray_ptr pjVar6;
  _func_void_j_decompress_ptr *__s;
  _func_void_j_decompress_ptr *p_Var7;
  long lVar8;
  _func_void_j_decompress_ptr **pp_Var9;
  int *piVar10;
  code *pcVar11;
  code *pcVar12;
  
  pjVar3 = (jpeg_d_coef_controller *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0xe0);
  cinfo->coef = pjVar3;
  pjVar3->start_input_pass = start_input_pass;
  pjVar3->start_output_pass = start_output_pass;
  pjVar3[5].start_output_pass = (_func_void_j_decompress_ptr *)0x0;
  if (need_full_buffer == 0) {
    __s = (_func_void_j_decompress_ptr *)(*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,0x500);
    p_Var7 = __s;
    for (lVar8 = 0; lVar8 != 10; lVar8 = lVar8 + 1) {
      (&pjVar3[1].start_output_pass)[lVar8] = p_Var7;
      p_Var7 = p_Var7 + 0x80;
    }
    pcVar12 = decompress_onepass;
    pcVar11 = dummy_consume_data;
    if (cinfo->lim_Se == 0) {
      pp_Var9 = (_func_void_j_decompress_ptr **)0x0;
      memset(__s,0,0x500);
    }
    else {
      pp_Var9 = (_func_void_j_decompress_ptr **)0x0;
    }
  }
  else {
    pp_Var9 = &pjVar3[3].start_output_pass;
    piVar10 = &cinfo->comp_info->h_samp_factor;
    for (lVar8 = 0; lVar8 < cinfo->num_components; lVar8 = lVar8 + 1) {
      JVar2 = piVar10[1] * 3;
      if (cinfo->progressive_mode == 0) {
        JVar2 = piVar10[1];
      }
      p_Var1 = cinfo->mem->request_virt_barray;
      lVar4 = jround_up((ulong)(uint)piVar10[5],(long)*piVar10);
      lVar5 = jround_up((ulong)(uint)piVar10[6],(long)piVar10[1]);
      pjVar6 = (*p_Var1)((j_common_ptr)cinfo,1,1,(JDIMENSION)lVar4,(JDIMENSION)lVar5,JVar2);
      pp_Var9[lVar8] = (_func_void_j_decompress_ptr *)pjVar6;
      piVar10 = piVar10 + 0x18;
    }
    pcVar12 = decompress_data;
    pcVar11 = consume_data;
  }
  pjVar3->consume_data = pcVar11;
  pjVar3->decompress_data = pcVar12;
  pjVar3->coef_arrays = (jvirt_barray_ptr *)pp_Var9;
  return;
}

Assistant:

GLOBAL(void)
jinit_d_coef_controller (j_decompress_ptr cinfo, boolean need_full_buffer)
{
  my_coef_ptr coef;

  coef = (my_coef_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_coef_controller));
  cinfo->coef = (struct jpeg_d_coef_controller *) coef;
  coef->pub.start_input_pass = start_input_pass;
  coef->pub.start_output_pass = start_output_pass;
#ifdef BLOCK_SMOOTHING_SUPPORTED
  coef->coef_bits_latch = NULL;
#endif

  /* Create the coefficient buffer. */
  if (need_full_buffer) {
#ifdef D_MULTISCAN_FILES_SUPPORTED
    /* Allocate a full-image virtual array for each component, */
    /* padded to a multiple of samp_factor DCT blocks in each direction. */
    /* Note we ask for a pre-zeroed array. */
    int ci, access_rows;
    jpeg_component_info *compptr;

    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	 ci++, compptr++) {
      access_rows = compptr->v_samp_factor;
#ifdef BLOCK_SMOOTHING_SUPPORTED
      /* If block smoothing could be used, need a bigger window */
      if (cinfo->progressive_mode)
	access_rows *= 3;
#endif
      coef->whole_image[ci] = (*cinfo->mem->request_virt_barray)
	((j_common_ptr) cinfo, JPOOL_IMAGE, TRUE,
	 (JDIMENSION) jround_up((long) compptr->width_in_blocks,
				(long) compptr->h_samp_factor),
	 (JDIMENSION) jround_up((long) compptr->height_in_blocks,
				(long) compptr->v_samp_factor),
	 (JDIMENSION) access_rows);
    }
    coef->pub.consume_data = consume_data;
    coef->pub.decompress_data = decompress_data;
    coef->pub.coef_arrays = coef->whole_image; /* link to virtual arrays */
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    /* We only need a single-MCU buffer. */
    JBLOCKROW buffer;
    int i;

    buffer = (JBLOCKROW)
      (*cinfo->mem->alloc_large) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  D_MAX_BLOCKS_IN_MCU * SIZEOF(JBLOCK));
    for (i = 0; i < D_MAX_BLOCKS_IN_MCU; i++) {
      coef->MCU_buffer[i] = buffer + i;
    }
    if (cinfo->lim_Se == 0)	/* DC only case: want to bypass later */
      FMEMZERO((void FAR *) buffer,
	       (size_t) (D_MAX_BLOCKS_IN_MCU * SIZEOF(JBLOCK)));
    coef->pub.consume_data = dummy_consume_data;
    coef->pub.decompress_data = decompress_onepass;
    coef->pub.coef_arrays = NULL; /* flag for no virtual arrays */
  }
}